

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FxExpression * ParseAtan2(FScanner *sc,FName *identifier,PClassActor *cls)

{
  FxExpression *pFVar1;
  FxExpression *pFVar2;
  FScanner *local_b8;
  bool local_89;
  FScriptPosition local_88;
  undefined1 local_71;
  FScanner *local_70;
  byte local_65;
  FScriptPosition local_58;
  undefined1 local_41;
  FScanner *local_40;
  FxExpression *local_38;
  FxExpression *b;
  FxExpression *a;
  PClassActor *cls_local;
  FName *identifier_local;
  FScanner *sc_local;
  
  a = (FxExpression *)cls;
  cls_local = (PClassActor *)identifier;
  identifier_local = (FName *)sc;
  b = ParseExpressionM(sc,cls);
  FScanner::MustGetToken((FScanner *)identifier_local,0x2c);
  local_38 = ParseExpressionM((FScanner *)identifier_local,(PClassActor *)a);
  FScanner::MustGetToken((FScanner *)identifier_local,0x29);
  local_89 = FName::operator==(identifier,NAME_ATan2);
  local_41 = 0;
  local_65 = 0;
  local_71 = 0;
  if (local_89) {
    local_b8 = (FScanner *)operator_new(0x48);
    pFVar2 = b;
    pFVar1 = local_38;
    local_41 = 1;
    local_40 = local_b8;
    FScriptPosition::FScriptPosition(&local_58,(FScanner *)identifier_local);
    local_65 = 1;
    FxATan2::FxATan2((FxATan2 *)local_b8,pFVar2,pFVar1,&local_58);
    local_41 = 0;
  }
  else {
    local_b8 = (FScanner *)operator_new(0x48);
    pFVar2 = b;
    pFVar1 = local_38;
    local_71 = 1;
    local_70 = local_b8;
    FScriptPosition::FScriptPosition(&local_88,(FScanner *)identifier_local);
    FxATan2::FxATan2((FxATan2 *)local_b8,pFVar1,pFVar2,&local_88);
    local_71 = 0;
  }
  local_89 = !local_89;
  sc_local = local_b8;
  if (local_89) {
    FScriptPosition::~FScriptPosition(&local_88);
  }
  if ((local_65 & 1) != 0) {
    FScriptPosition::~FScriptPosition(&local_58);
  }
  return (FxExpression *)sc_local;
}

Assistant:

static FxExpression *ParseAtan2(FScanner &sc, FName identifier, PClassActor *cls)
{
	FxExpression *a = ParseExpressionM(sc, cls);
	sc.MustGetToken(',');
	FxExpression *b = ParseExpressionM(sc, cls);
	sc.MustGetToken(')');
	return identifier == NAME_ATan2 ? new FxATan2(a, b, sc) : new FxATan2(b, a, sc);
}